

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

SUNErrCode N_VScaleVectorArray_ManyVector(int nvec,sunrealtype *c,N_Vector *X,N_Vector *Z)

{
  void *__ptr;
  void *__ptr_00;
  long in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  N_Vector *Zsub;
  N_Vector *Xsub;
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  long local_38;
  long local_30;
  
  __ptr = malloc((long)in_EDI << 3);
  __ptr_00 = malloc((long)in_EDI << 3);
  for (local_30 = 0; local_30 < **(long **)*in_RDX; local_30 = local_30 + 1) {
    for (local_38 = 0; local_38 < in_EDI; local_38 = local_38 + 1) {
      *(undefined8 *)((long)__ptr + local_38 * 8) =
           *(undefined8 *)(*(long *)(*(long *)in_RDX[local_38] + 0x10) + local_30 * 8);
      *(undefined8 *)((long)__ptr_00 + local_38 * 8) =
           *(undefined8 *)(*(long *)(**(long **)(in_RCX + local_38 * 8) + 0x10) + local_30 * 8);
    }
    N_VScaleVectorArray(in_EDI,in_RSI,__ptr,__ptr_00);
  }
  free(__ptr);
  free(__ptr_00);
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VScaleVectorArray)(int nvec, sunrealtype* c, N_Vector* X,
                                         N_Vector* Z)
{
  SUNFunctionBegin(X[0]->sunctx);
  sunindextype i, j;
  N_Vector *Xsub, *Zsub;

  SUNAssert(nvec > 0, SUN_ERR_ARG_OUTOFRANGE);

  /* create arrays of nvec N_Vector pointers for reuse within loop */
  Xsub = NULL;
  Zsub = NULL;
  Xsub = (N_Vector*)malloc(nvec * sizeof(N_Vector));
  SUNAssert(Xsub, SUN_ERR_MALLOC_FAIL);
  Zsub = (N_Vector*)malloc(nvec * sizeof(N_Vector));
  SUNAssert(Zsub, SUN_ERR_MALLOC_FAIL);

  /* perform operation by calling N_VScaleVectorArray for each subvector */
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(X[0]); i++)
  {
    /* for each subvector, create the array of subvectors of X, Y and Z */
    for (j = 0; j < nvec; j++)
    {
      Xsub[j] = MANYVECTOR_SUBVEC(X[j], i);
      Zsub[j] = MANYVECTOR_SUBVEC(Z[j], i);
    }

    /* now call N_VScaleVectorArray for this array of subvectors */
    SUNCheckCall(N_VScaleVectorArray(nvec, c, Xsub, Zsub));
  }

  /* clean up and return */
  free(Xsub);
  free(Zsub);
  return SUN_SUCCESS;
}